

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O2

int __thiscall re2::PCRE::NumberOfCapturingGroups(PCRE *this)

{
  return -1;
}

Assistant:

int PCRE::NumberOfCapturingGroups() const {
  if (re_partial_ == NULL) return -1;

  int result;
  CHECK(pcre_fullinfo(re_partial_,       // The regular expression object
                      NULL,              // We did not study the pattern
                      PCRE_INFO_CAPTURECOUNT,
                      &result) == 0);
  return result;
}